

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_findFrameCompressedSize(void *src,size_t srcSize)

{
  ushort uVar1;
  size_t sVar2;
  size_t sVar3;
  ushort *puVar4;
  ulong uVar5;
  BYTE *ipstart;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader ZStack_38;
  
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    sVar3 = ZSTD_getFrameHeader_advanced(&ZStack_38,src,srcSize,ZSTD_f_zstd1);
    sVar2 = 0xffffffffffffffb8;
    if (0xffffffffffffff88 < sVar3) {
      sVar2 = sVar3;
    }
    if (sVar3 == 0) {
      uVar5 = (ulong)ZStack_38.headerSize;
      puVar4 = (ushort *)((long)src + uVar5);
      uVar9 = srcSize - uVar5;
      sVar3 = sVar2;
      do {
        sVar2 = 0xffffffffffffffb8;
        if (2 < uVar9) {
          uVar1 = *puVar4;
          uVar5 = (ulong)(uVar1 & 1);
          uVar6 = uVar1 >> 1 & 3;
          sVar2 = (size_t)uVar6;
          if (uVar6 != 1) {
            if (uVar6 == 3) {
              sVar2 = 0xffffffffffffffec;
            }
            else {
              sVar2 = (size_t)(uint3)(CONCAT12((char)puVar4[1],uVar1) >> 3);
            }
          }
        }
        cVar8 = '\x01';
        if (sVar2 < 0xffffffffffffff89) {
          uVar7 = sVar2 + 3;
          if (uVar9 < uVar7) {
            sVar2 = 0xffffffffffffffb8;
          }
          else {
            puVar4 = (ushort *)((long)puVar4 + uVar7);
            cVar8 = ((int)uVar5 != 0) * '\x03';
            sVar2 = sVar3;
            uVar9 = uVar9 - uVar7;
          }
        }
        sVar3 = sVar2;
      } while (cVar8 == '\0');
      if (cVar8 == '\x03') {
        if (ZStack_38.checksumFlag != 0) {
          if (uVar9 < 4) {
            return 0xffffffffffffffb8;
          }
          puVar4 = puVar4 + 2;
        }
        sVar2 = (long)puVar4 - (long)src;
      }
    }
  }
  else {
    sVar2 = (ulong)*(uint *)((long)src + 4) + 8;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_findFrameCompressedSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
#endif
    if ( (srcSize >= ZSTD_skippableHeaderSize)
      && (MEM_readLE32(src) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START ) {
        return ZSTD_skippableHeaderSize + MEM_readLE32((const BYTE*)src + ZSTD_frameIdSize);
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret)) return ret;
            if (ret > 0) return ERROR(srcSize_wrong);
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Loop on each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ERROR(srcSize_wrong);

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;

            if (blockProperties.lastBlock) break;
        }

        if (zfh.checksumFlag) {   /* Final frame content checksum */
            if (remainingSize < 4) return ERROR(srcSize_wrong);
            ip += 4;
            remainingSize -= 4;
        }

        return ip - ipstart;
    }
}